

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int BREFILL(p_ply ply)

{
  size_t sVar1;
  size_t size;
  p_ply ply_local;
  
  sVar1 = ply->buffer_last - ply->buffer_first;
  memmove(ply->buffer,ply->buffer + ply->buffer_first,sVar1);
  ply->buffer_last = sVar1;
  ply->buffer_token = 0;
  ply->buffer_first = 0;
  sVar1 = fread((void *)((long)ply + sVar1 + 0x48),1,0x1fff - sVar1,(FILE *)ply->fp);
  ply->buffer_last = sVar1 + ply->buffer_last;
  ply->buffer[ply->buffer_last] = '\0';
  return (int)(sVar1 != 0);
}

Assistant:

static int BREFILL(p_ply ply) {
    /* move untouched data to beginning of buffer */
    size_t size = BSIZE(ply);
    memmove(ply->buffer, BFIRST(ply), size);
    ply->buffer_last = size;
    ply->buffer_first = ply->buffer_token = 0;
    /* fill remaining with new data */
    size = fread(ply->buffer+size, 1, BUFFERSIZE-size-1, ply->fp);
    /* increase size to account for new data */
    ply->buffer_last += size;
    /* place sentinel so we can use str* functions with buffer */
    ply->buffer[ply->buffer_last] = '\0';
    /* check if read failed */
    return size > 0;
}